

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_invoke_helpers.hpp
# Opt level: O1

void asio_handler_invoke_helpers::
     invoke<asio::detail::binder1<tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0,std::error_code>,tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0>
               (binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>
                *function,anon_class_8_1_8991fb9c *context)

{
  int iVar1;
  socket_type sVar2;
  HTTPRequester *this;
  basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *pbVar3;
  long lVar4;
  ErrorResult *pEVar5;
  OutputWorker *this_00;
  basic_streambuf<std::allocator<char>_> *op;
  thread_info_base *this_thread;
  long in_FS_OFFSET;
  Result result;
  undefined1 local_208 [20];
  undefined1 local_1f4;
  error_category *local_1e8;
  pointer local_1e0;
  pointer local_1d8;
  base_implementation_type *local_1d0;
  error_code local_1c8;
  undefined1 local_1b8 [8];
  basic_streambuf_ref<std::allocator<char>_> local_1b0;
  undefined1 auStack_1a8 [32];
  int local_188;
  size_t local_180;
  anon_class_8_1_8991fb9c_for_handler_ local_178;
  ios_base local_138 [264];
  
  this = (function->handler_).this;
  this->AsyncRefs = this->AsyncRefs + -1;
  if ((function->arg1_)._M_value == 0) {
    if (DAT_001bde60 < 3) {
      local_1b8 = (undefined1  [8])tonk::gateway::ModuleLogger;
      local_1b0.sb_._0_4_ = 2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_1a8,DAT_001bde90,DAT_001bde98);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_1a8,"Making HTTP request: ",0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_1a8,(this->URL).FullURL._M_dataplus._M_p,
                 (this->URL).FullURL._M_string_length);
      this_00 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_00,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a8);
      std::ios_base::~ios_base(local_138);
    }
    this->AsyncRefs = this->AsyncRefs + 1;
    pbVar3 = (this->Socket_TCP)._M_t.
             super___uniq_ptr_impl<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
             .
             super__Head_base<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_false>
             ._M_head_impl;
    local_1e0 = (this->Request)._M_dataplus._M_p;
    local_1d8 = (pointer)(this->Request)._M_string_length;
    local_1b8 = (undefined1  [8])local_208;
    lVar4 = *(long *)&(pbVar3->
                      super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>
                      ).super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>;
    local_1d0 = (base_implementation_type *)
                ((long)&(pbVar3->
                        super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>
                        ).super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true> +
                8);
    if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
      this_thread = (thread_info_base *)0x0;
    }
    else {
      this_thread = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -0x10) + 8);
    }
    local_208._0_8_ = this;
    op = (basic_streambuf<std::allocator<char>_> *)
         asio::detail::thread_info_base::allocate(this_thread,0x60);
    auStack_1a8._0_8_ =
         (reactive_socket_send_op<asio::const_buffers_1,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1608:13)>
          *)0x0;
    sVar2 = (((implementation_type *)
             ((long)&(pbVar3->
                     super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>)
                     .super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true> + 8))
            ->super_base_implementation_type).socket_;
    *(undefined8 *)op = 0;
    *(code **)&op->field_0x8 =
         asio::detail::
         reactive_socket_send_op<asio::const_buffers_1,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1608:13)>
         ::do_complete;
    *(uint *)&op->field_0x10 = 0;
    ((error_code *)&op->field_0x18)->_M_value = 0;
    local_1b0.sb_ = op;
    local_1e8 = (error_category *)std::_V2::system_category();
    *(error_category **)&op->field_0x20 = local_1e8;
    *(size_t *)&op->field_0x28 = 0;
    *(code **)&op->field_0x30 =
         asio::detail::reactive_socket_send_op_base<asio::const_buffers_1>::do_perform;
    *(socket_type *)&op->field_0x38 = sVar2;
    (((const_buffers_1 *)&op->max_size_)->super_const_buffer).data_ = local_1e0;
    (op->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = local_1d8;
    *(undefined4 *)
     &(op->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = 0;
    (op->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_208._0_8_;
    auStack_1a8._0_8_ = op;
    asio::detail::reactive_socket_service_base::start_op
              ((reactive_socket_service_base *)(lVar4 + 0x28),local_1d0,1,(reactor_op *)op,false,
               true,(bool)(local_1d8 == (pointer)0x0 &
                          *(state_type *)
                           ((long)&(pbVar3->
                                   super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>
                                   ).
                                   super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>
                           + 0xc) >> 4));
    local_1b0.sb_ = (basic_streambuf<std::allocator<char>_> *)0x0;
    auStack_1a8._0_8_ =
         (reactive_socket_send_op<asio::const_buffers_1,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1608:13)>
          *)0x0;
    asio::detail::
    reactive_socket_send_op<asio::const_buffers_1,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1608:13)>
    ::ptr::reset((ptr *)local_1b8);
    this->AsyncRefs = this->AsyncRefs + 1;
    local_1b8 = (undefined1  [8])
                (this->Socket_TCP)._M_t.
                super___uniq_ptr_impl<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
                .
                super__Head_base<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_false>
                ._M_head_impl;
    local_208._16_4_ = 0xa0d0a0d;
    local_208._8_8_ = 4;
    local_1f4 = 0;
    local_1b0.sb_ = &this->TCPStreamBuf;
    auStack_1a8._16_4_ = 0xa0d0a0d;
    auStack_1a8._8_8_ = 4;
    auStack_1a8[0x14] = '\0';
    local_188 = 0;
    local_180 = 0;
    local_1c8._M_value = 0;
    local_1c8._M_cat = local_1e8;
    local_208._0_8_ = (ErrorResult *)(local_208 + 0x10);
    auStack_1a8._0_8_ =
         (reactive_socket_send_op<asio::const_buffers_1,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1608:13)>
          *)(auStack_1a8 + 0x10);
    local_178.this = this;
    asio::detail::
    read_until_delim_string_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1629:13)>
    ::operator()((read_until_delim_string_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1629:13)>
                  *)local_1b8,&local_1c8,0,1);
    if ((reactive_socket_send_op<asio::const_buffers_1,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1608:13)>
         *)auStack_1a8._0_8_ !=
        (reactive_socket_send_op<asio::const_buffers_1,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1608:13)>
         *)(auStack_1a8 + 0x10)) {
      operator_delete((void *)auStack_1a8._0_8_);
    }
    if ((ErrorResult *)local_208._0_8_ != (ErrorResult *)(local_208 + 0x10)) {
      operator_delete((void *)local_208._0_8_);
    }
  }
  else {
    (**(code **)(*(long *)(function->arg1_)._M_cat + 0x20))(local_1b8);
    iVar1 = (function->arg1_)._M_value;
    pEVar5 = (ErrorResult *)operator_new(0x38);
    pEVar5->Source = "Connection failed";
    (pEVar5->Description)._M_dataplus._M_p = (pointer)&(pEVar5->Description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pEVar5->Description,local_1b8,
               (char *)((long)&(((basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>
                                  *)local_1b8)->
                               super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>
                               ).service_ +
                       (long)&(((reactive_socket_send_op_base<asio::const_buffers_1> *)
                               &(local_1b0.sb_)->super_streambuf)->super_reactor_op).super_operation
                       ));
    pEVar5->Type = Asio;
    pEVar5->Code = (long)iVar1;
    local_208._0_8_ = pEVar5;
    if (local_1b8 != (undefined1  [8])auStack_1a8) {
      operator_delete((void *)local_1b8);
    }
    tonk::gateway::HTTPRequester::OnDone(this,(Result *)local_208,0,(char *)0x0,0);
    tonk::Result::~Result((Result *)local_208);
  }
  return;
}

Assistant:

inline void invoke(Function& function, Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  Function tmp(function);
  tmp();
#else
  using asio::asio_handler_invoke;
  asio_handler_invoke(function, asio::detail::addressof(context));
#endif
}